

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O2

void soplex::updateRes<double>
               (SVSetBase<double> *facset,SSVectorBase<double> *resvecprev,
               SSVectorBase<double> *resvec,SSVectorBase<double> *tmpvec,double eprev,double qcurr,
               double epsilon)

{
  int dummy2;
  int dummy1;
  int local_28 [2];
  
  if (ABS(eprev) <= epsilon) {
    SSVectorBase<double>::clear(resvec);
  }
  else {
    SSVectorBase<double>::operator*=(resvec,eprev);
  }
  local_28[1] = 0;
  local_28[0] = 0;
  SSVectorBase<double>::assign2product4setup<double,double>
            (tmpvec,facset,resvecprev,(Timer *)0x0,(Timer *)0x0,local_28 + 1,local_28);
  SSVectorBase<double>::setup(tmpvec);
  SSVectorBase<double>::operator+=(resvec,tmpvec);
  SSVectorBase<double>::operator*=(resvec,-1.0 / qcurr);
  SSVectorBase<double>::setup(resvec);
  return;
}

Assistant:

static inline void updateRes(
   const SVSetBase<R> facset,
   const SSVectorBase<R> resvecprev,
   SSVectorBase<R>& resvec,
   SSVectorBase<R>& tmpvec,
   R eprev,
   R qcurr,
   R epsilon)
{
   assert(qcurr != 0.0);

   if(isZero(eprev, epsilon))
      resvec.clear();
   else
      resvec *= eprev;

   int dummy1 = 0;
   int dummy2 = 0;
   tmpvec.assign2product4setup(facset, resvecprev, nullptr, nullptr, dummy1, dummy2);
   tmpvec.setup();
   resvec += tmpvec;

   resvec *= (-1.0 / qcurr);
   resvec.setup();
}